

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRExpression * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::
allocate<std::__cxx11::string&,unsigned_int&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRExpression> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p,uint *p_1,bool *p_2)

{
  Vector<diligent_spirv_cross::SPIRExpression_*> *this_00;
  size_t sVar1;
  pointer pcVar2;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
  _Var3;
  ulong count;
  _Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> _Var4;
  SPIRExpression *this_01;
  string local_50;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>)malloc(count * 0xf0);
    if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
        (SPIRExpression *)0x0) {
      SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,count);
      _Var4._M_head_impl =
           (SPIRExpression *)
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.
                           buffer_size + 1);
        sVar1 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size
        ;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.ptr[sVar1] =
             _Var4._M_head_impl;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size =
             sVar1 + 1;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
      .super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> =
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl !=
          (SPIRExpression *)0x0) goto LAB_007b3e63;
    }
    this_01 = (SPIRExpression *)0x0;
  }
  else {
LAB_007b3e63:
    sVar1 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.ptr
              [sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    pcVar2 = (p->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + p->_M_string_length);
    SPIRExpression::SPIRExpression(this_01,&local_50,(TypeID)*p_1,*p_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}